

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_pray(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  FILE *__stream;
  char *pcVar2;
  CHAR_DATA *ch_00;
  char *pcVar3;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  CHAR_DATA *victim;
  DESCRIPTOR_DATA *d;
  FILE *fp;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed88;
  CHAR_DATA *in_stack_ffffffffffffed90;
  undefined4 in_stack_ffffffffffffed98;
  uint in_stack_ffffffffffffed9c;
  CHAR_DATA *local_1248;
  DESCRIPTOR_DATA *local_1228;
  char local_1218 [4616];
  char *local_10;
  CHAR_DATA *local_8;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  }
  else {
    uVar1 = in_RDI->comm[0];
    local_10 = in_RSI;
    local_8 = in_RDI;
    _Var4 = std::pow<int,int>(0,0x528583);
    if ((uVar1 & (long)_Var4) == 0) {
      WAIT_STATE(in_stack_ffffffffffffed90,(int)((ulong)in_stack_ffffffffffffed88 >> 0x20));
      send_to_char((char *)in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
      __stream = fopen("../logs/prays.txt","a");
      if (__stream != (FILE *)0x0) {
        pcVar2 = log_time();
        sprintf(local_1218,"%s: %s [%d] is PRAYing for: %s\n",pcVar2,local_8->true_name,
                (ulong)(uint)(int)local_8->in_room->vnum,local_10);
        fprintf(__stream,"%s",local_1218);
        fclose(__stream);
      }
      for (local_1228 = descriptor_list; local_1228 != (DESCRIPTOR_DATA *)0x0;
          local_1228 = local_1228->next) {
        if (local_1228->original == (CHAR_DATA *)0x0) {
          local_1248 = local_1228->character;
        }
        else {
          local_1248 = local_1228->original;
        }
        if ((local_1228->connected == 0) && (local_1228->character != local_8)) {
          uVar1 = local_1248->comm[0];
          _Var4 = std::pow<int,int>(0,0x528702);
          if ((uVar1 & (long)_Var4) == 0) {
            uVar1 = local_1248->comm[0];
            _Var4 = std::pow<int,int>(0,0x528736);
            if (((uVar1 & (long)_Var4) == 0) && (0x33 < local_1248->level)) {
              ch_00 = (CHAR_DATA *)
                      get_char_color((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),
                                     (char *)in_stack_ffffffffffffed90);
              pcVar2 = local_10;
              in_stack_ffffffffffffed90 = (CHAR_DATA *)local_8->true_name;
              in_stack_ffffffffffffed9c = (uint)local_8->in_room->vnum;
              pcVar3 = END_COLOR(ch_00);
              sprintf(local_1218,"%s%s [%d] is PRAYing for: %s%s\n\r",ch_00,
                      in_stack_ffffffffffffed90,(ulong)in_stack_ffffffffffffed9c,pcVar2,pcVar3);
              send_to_char((char *)in_stack_ffffffffffffed90,ch_00);
            }
          }
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
    }
  }
  return;
}

Assistant:

void do_pray(CHAR_DATA *ch, char *argument)
{
	if (argument[0] == '\0')
	{
		send_to_char("Pray what?\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOCHANNELS))
	{
		send_to_char("You can't pray.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, 10);

	send_to_char("You pray to the heavens!\n\r", ch);

	char buf[MAX_STRING_LENGTH];

	auto fp = fopen(PRAYER_FILE, "a");
	if (fp)
	{
		sprintf(buf, "%s: %s [%d] is PRAYing for: %s\n",
				log_time(),
				ch->true_name,
				ch->in_room->vnum,
				argument);
		fprintf(fp, "%s", buf);
		fclose(fp);
	}

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		auto victim = d->original ? d->original : d->character;

		if (d->connected == CON_PLAYING && d->character != ch && !IS_SET(victim->comm, COMM_SHOUTSOFF) && !IS_SET(victim->comm, COMM_QUIET) && victim->level >= 52)
		{
			sprintf(buf, "%s%s [%d] is PRAYing for: %s%s\n\r",
					get_char_color(victim, "prays"),
					ch->true_name,
					ch->in_room->vnum,
					argument,
					END_COLOR(victim));
			send_to_char(buf, d->character);
		}
	}
}